

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

void P_FakeZMovement(AActor *mo)

{
  uint uVar1;
  AActor *pAVar2;
  AActor *other;
  bool bVar3;
  double dVar4;
  byte local_59;
  TAngle<double> local_40;
  TFlags<ActorFlag,_unsigned_int> local_34;
  double local_30;
  double delta;
  double dist;
  TFlags<ActorFlag,_unsigned_int> local_18;
  TFlags<ActorFlag,_unsigned_int> local_14;
  AActor *local_10;
  AActor *mo_local;
  
  local_10 = mo;
  AActor::AddZ(mo,(mo->Vel).Z,true);
  TFlags<ActorFlag,_unsigned_int>::operator&
            (&local_14,
             (int)local_10 +
             (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE));
  uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_14);
  bVar3 = false;
  if (uVar1 != 0) {
    pAVar2 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&local_10->target);
    bVar3 = pAVar2 != (AActor *)0x0;
  }
  if (bVar3) {
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_18,
               (int)local_10 +
               (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE));
    uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_18);
    bVar3 = false;
    if (uVar1 == 0) {
      TFlags<ActorFlag,_unsigned_int>::operator&
                ((TFlags<ActorFlag,_unsigned_int> *)((long)&dist + 4),
                 (int)local_10 +
                 (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE))
      ;
      uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&dist + 4));
      bVar3 = uVar1 == 0;
    }
    pAVar2 = local_10;
    if (bVar3) {
      other = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&local_10->target);
      delta = AActor::Distance2D(pAVar2,other,false);
      pAVar2 = TObjPtr<AActor>::operator->(&local_10->target);
      dVar4 = AActor::Center(pAVar2);
      local_30 = AActor::Z(local_10);
      local_30 = dVar4 - local_30;
      if ((0.0 <= local_30) || (-(local_30 * 3.0) <= delta)) {
        if ((0.0 < local_30) && (delta < local_30 * 3.0)) {
          AActor::AddZ(local_10,local_10->FloatSpeed,true);
        }
      }
      else {
        AActor::AddZ(local_10,-local_10->FloatSpeed,true);
      }
    }
  }
  local_59 = 0;
  if (local_10->player != (player_t *)0x0) {
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_34,
               (int)local_10 +
               (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE));
    uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_34);
    local_59 = 0;
    if (uVar1 != 0) {
      dVar4 = AActor::Z(local_10);
      local_59 = 0;
      if (local_10->floorz <= dVar4 && dVar4 != local_10->floorz) {
        bVar3 = AActor::IsNoClip2(local_10);
        local_59 = bVar3 ^ 0xff;
      }
    }
  }
  pAVar2 = local_10;
  if ((local_59 & 1) != 0) {
    TAngle<double>::TAngle(&local_40,(double)level.maptime * 4.5);
    dVar4 = TAngle<double>::Sin(&local_40);
    AActor::AddZ(pAVar2,dVar4,true);
  }
  dVar4 = AActor::Z(local_10);
  if (dVar4 <= local_10->floorz) {
    AActor::SetZ(local_10,local_10->floorz,true);
  }
  dVar4 = AActor::Top(local_10);
  if (local_10->ceilingz <= dVar4 && dVar4 != local_10->ceilingz) {
    AActor::SetZ(local_10,local_10->ceilingz - local_10->Height,true);
  }
  return;
}

Assistant:

void P_FakeZMovement(AActor *mo)
{
	//
	// adjust height
	//
	mo->AddZ(mo->Vel.Z);
	if ((mo->flags&MF_FLOAT) && mo->target)
	{ // float down towards target if too close
		if (!(mo->flags & MF_SKULLFLY) && !(mo->flags & MF_INFLOAT))
		{
			double dist = mo->Distance2D(mo->target);
			double delta = mo->target->Center() - mo->Z();
			if (delta < 0 && dist < -(delta * 3))
				mo->AddZ(-mo->FloatSpeed);
			else if (delta > 0 && dist < (delta * 3))
				mo->AddZ(mo->FloatSpeed);
		}
	}
	if (mo->player && mo->flags&MF_NOGRAVITY && (mo->Z() > mo->floorz) && !mo->IsNoClip2())
	{
		mo->AddZ(DAngle(4.5 * level.maptime).Sin());
	}

	//
	// clip movement
	//
	if (mo->Z() <= mo->floorz)
	{ // hit the floor
		mo->SetZ(mo->floorz);
	}

	if (mo->Top() > mo->ceilingz)
	{ // hit the ceiling
		mo->SetZ(mo->ceilingz - mo->Height);
	}
}